

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_scanPi(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char cVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  byte *pbVar6;
  uint uVar7;
  char **ppcVar9;
  char *pcVar10;
  undefined8 extraout_RDX;
  undefined8 uVar11;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  byte *pbVar12;
  long lStack_50;
  int tok;
  uint uVar8;
  
  ppcVar9 = (char **)(end + -(long)ptr);
  if ((long)ppcVar9 < 1) {
    return -1;
  }
  cVar1 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  lVar3 = 1;
  lStack_50 = lVar3;
  if (cVar1 == '\x05') {
    if (ppcVar9 == (char **)0x1) {
      return -2;
    }
    iVar4 = (*enc[3].literalScanners[0])(enc,ptr,end,ppcVar9);
    if (iVar4 == 0) {
      *nextTokPtr = ptr;
      return 0;
    }
    lStack_50 = 2;
LAB_0034af8f:
    pbVar12 = (byte *)(ptr + lStack_50);
    while( true ) {
      uVar5 = (long)end - (long)pbVar12;
      if ((long)uVar5 < 1) {
        return -1;
      }
      uVar8 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar12);
      uVar7 = uVar8 - 5;
      if (0x18 < uVar7) break;
      pcVar10 = (char *)((long)&switchD_0034afcb::switchdataD_0049035c +
                        (long)(int)(&switchD_0034afcb::switchdataD_0049035c)[uVar7]);
      lStack_50 = lVar3;
      switch(uVar8) {
      case 5:
        if (uVar5 == 1) {
          return -2;
        }
        iVar4 = (*enc[3].scanners[0])(enc,(char *)pbVar12,pcVar10,(char **)0x1);
        lStack_50 = 2;
        break;
      case 6:
        if (uVar5 < 3) {
          return -2;
        }
        iVar4 = (*enc[3].scanners[1])(enc,(char *)pbVar12,pcVar10,(char **)0x1);
        lStack_50 = 3;
        break;
      case 7:
        if (uVar5 < 4) {
          return -2;
        }
        iVar4 = (*enc[3].scanners[2])(enc,(char *)pbVar12,pcVar10,(char **)0x1);
        lStack_50 = 4;
        break;
      default:
        goto switchD_0034afcb_caseD_8;
      case 9:
      case 10:
      case 0x15:
        iVar4 = normal_checkPiTarget((ENCODING *)ptr,(char *)pbVar12,(char *)&tok,(int *)0x1);
        if (iVar4 == 0) goto switchD_0034afcb_caseD_1d;
        uVar11 = extraout_RDX;
        pbVar12 = pbVar12 + 1;
        goto LAB_0034b05c;
      case 0xf:
        iVar4 = normal_checkPiTarget((ENCODING *)ptr,(char *)pbVar12,(char *)&tok,(int *)0x1);
        if (iVar4 == 0) goto switchD_0034afcb_caseD_1d;
        pbVar6 = pbVar12 + 1;
        if ((byte *)end == pbVar6 || (long)end - (long)pbVar6 < 0) {
          return -1;
        }
        if (*pbVar6 == 0x3e) {
          *nextTokPtr = (char *)(pbVar12 + 2);
          return tok;
        }
        goto LAB_0034b18c;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_0034afcb_caseD_16;
      case 0x1d:
        goto switchD_0034afcb_caseD_1d;
      }
      if (iVar4 == 0) {
switchD_0034afcb_caseD_1d:
        *nextTokPtr = (char *)pbVar12;
        return 0;
      }
switchD_0034afcb_caseD_16:
      pbVar12 = pbVar12 + lStack_50;
    }
switchD_0034afcb_caseD_8:
    pbVar6 = pbVar12;
LAB_0034b18c:
    *nextTokPtr = (char *)pbVar6;
  }
  else {
    if (cVar1 == '\x06') {
      if (ppcVar9 < (char **)0x3) {
        return -2;
      }
      iVar4 = (*enc[3].literalScanners[1])(enc,ptr,end,ppcVar9);
      lStack_50 = 3;
LAB_0034af60:
      if (iVar4 != 0) goto LAB_0034af8f;
    }
    else {
      if (cVar1 == '\a') {
        if (ppcVar9 < (char **)0x4) {
          return -2;
        }
        iVar4 = (*enc[3].nameMatchesAscii)(enc,ptr,end,(char *)ppcVar9);
        lStack_50 = 4;
        goto LAB_0034af60;
      }
      if ((cVar1 == '\x16') || (cVar1 == '\x18')) goto LAB_0034af8f;
    }
switchD_0034b088_caseD_0:
    *nextTokPtr = ptr;
  }
  return 0;
LAB_0034b05c:
  ptr = (char *)pbVar12;
  uVar5 = (long)end - (long)ptr;
  if ((long)uVar5 < 1) {
    return -1;
  }
  bVar2 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  if (0xf < (ulong)bVar2) {
switchD_0034b088_caseD_2:
    pbVar12 = (byte *)ptr + 1;
    goto LAB_0034b05c;
  }
  switch(bVar2) {
  case 0:
  case 1:
  case 8:
    goto switchD_0034b088_caseD_0;
  default:
    goto switchD_0034b088_caseD_2;
  case 5:
    if (uVar5 == 1) {
      return -2;
    }
    iVar4 = (*enc[3].nameLength)(enc,ptr);
    if (iVar4 != 0) goto switchD_0034b088_caseD_0;
    uVar11 = extraout_RDX_00;
    pbVar12 = (byte *)ptr + 2;
    break;
  case 6:
    if (uVar5 < 3) {
      return -2;
    }
    pcVar10 = (*enc[3].skipS)(enc,ptr);
    if ((int)pcVar10 != 0) goto switchD_0034b088_caseD_0;
    uVar11 = extraout_RDX_01;
    pbVar12 = (byte *)ptr + 3;
    break;
  case 7:
    if (uVar5 < 4) {
      return -2;
    }
    iVar4 = (*enc[3].getAtts)(enc,ptr,(int)uVar11,
                              (ATTRIBUTE *)
                              ((long)&switchD_0034b088::switchdataD_004903c0 +
                              (long)(int)(&switchD_0034b088::switchdataD_004903c0)[bVar2]));
    if (iVar4 != 0) goto switchD_0034b088_caseD_0;
    uVar11 = extraout_RDX_02;
    pbVar12 = (byte *)ptr + 4;
    break;
  case 0xf:
    pbVar12 = (byte *)ptr + 1;
    if ((byte *)end == pbVar12 || (long)end - (long)pbVar12 < 0) {
      return -1;
    }
    if (*pbVar12 == 0x3e) {
      *nextTokPtr = (char *)((byte *)ptr + 2);
      return tok;
    }
  }
  goto LAB_0034b05c;
}

Assistant:

static int PTRCALL
PREFIX(scanPi)(const ENCODING *enc, const char *ptr,
               const char *end, const char **nextTokPtr)
{
  int tok;
  const char *target = ptr;
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_S: case BT_CR: case BT_LF:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      while (HAS_CHAR(enc, ptr, end)) {
        switch (BYTE_TYPE(enc, ptr)) {
        INVALID_CASES(ptr, nextTokPtr)
        case BT_QUEST:
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr + MINBPC(enc);
            return tok;
          }
          break;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      return XML_TOK_PARTIAL;
    case BT_QUEST:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr + MINBPC(enc);
        return tok;
      }
      /* fall through */
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}